

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O2

btCollisionShape * __thiscall
btCollisionWorldImporter::createPlaneShape
          (btCollisionWorldImporter *this,btVector3 *planeNormal,btScalar planeConstant)

{
  btStaticPlaneShape *this_00;
  btStaticPlaneShape *local_20;
  
  this_00 = (btStaticPlaneShape *)btStaticPlaneShape::operator_new(0x68);
  btStaticPlaneShape::btStaticPlaneShape(this_00,planeNormal,planeConstant);
  local_20 = this_00;
  btAlignedObjectArray<btCollisionShape_*>::push_back
            (&this->m_allocatedCollisionShapes,(btCollisionShape **)&local_20);
  return (btCollisionShape *)this_00;
}

Assistant:

btCollisionShape* btCollisionWorldImporter::createPlaneShape(const btVector3& planeNormal,btScalar planeConstant)
{
	btStaticPlaneShape* shape = new btStaticPlaneShape(planeNormal,planeConstant);
	m_allocatedCollisionShapes.push_back(shape);
	return shape;
}